

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpConnection.cpp
# Opt level: O1

void __thiscall
gmlc::networking::TcpConnection::connect_handler(TcpConnection *this,error_code *error)

{
  element_type *peVar1;
  ostream *this_00;
  stringstream str;
  string local_1c0;
  stringstream local_1a0 [16];
  ostream local_190 [112];
  ios_base local_120 [264];
  
  if (error->_M_value != 0) {
    std::__cxx11::stringstream::stringstream(local_1a0);
    std::__ostream_insert<char,std::char_traits<char>>(local_190,"connection error ",0x11);
    (**(code **)(*(long *)error->_M_cat + 0x20))(&local_1c0,error->_M_cat,error->_M_value);
    this_00 = std::__ostream_insert<char,std::char_traits<char>>
                        (local_190,local_1c0._M_dataplus._M_p,local_1c0._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(this_00,": code =",8);
    std::ostream::operator<<(this_00,error->_M_value);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
      operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::stringbuf::str();
    logger(this,0,&local_1c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
      operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
    }
    LOCK();
    (this->connectionError)._M_base._M_i = true;
    UNLOCK();
    concurrency::TriggerVariable::activate(&this->connected);
    std::__cxx11::stringstream::~stringstream(local_1a0);
    std::ios_base::~ios_base(local_120);
    return;
  }
  (*((this->socket_).super___shared_ptr<gmlc::networking::Socket,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    )->_vptr_Socket[6])();
  concurrency::TriggerVariable::activate(&this->connected);
  peVar1 = (this->socket_).super___shared_ptr<gmlc::networking::Socket,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  (*peVar1->_vptr_Socket[0xc])(peVar1,1);
  return;
}

Assistant:

void TcpConnection::connect_handler(const std::error_code& error)
{
    if (!error) {
        socket_->handshake();
        connected.activate();
        socket_->set_option_no_delay(true);
    } else {
        std::stringstream str;

        str << "connection error " << error.message()
            << ": code =" << error.value();
        logger(0, str.str());
        connectionError = true;
        connected.activate();
    }
}